

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O2

uint32 __thiscall
Process::start(Process *this,String *program,int argc,char **argv,Map<String,_String> *environment)

{
  undefined8 uVar1;
  code *pcVar2;
  long lVar3;
  FILE *__stream;
  char **__argv;
  Iterator IVar4;
  uint32 uVar5;
  int iVar6;
  int *piVar7;
  long lVar8;
  char *pcVar9;
  char *pcVar10;
  long lVar11;
  char **ppcVar12;
  Iterator i_1;
  undefined1 this_00 [8];
  Iterator end;
  String **ppSVar13;
  long lStack_60;
  String *local_58;
  char **local_50;
  undefined1 auStack_48 [8];
  Array<String> envStringsBuf;
  
  ppSVar13 = &local_58;
  if (this->pid == 0) {
    if ((argc == 0) || (argv[(long)argc + -1] != (char *)0x0)) {
      lVar8 = (long)(int)(argc + (uint)(argc == 0));
      lVar3 = -(lVar8 * 8 + 0x17U & 0xfffffffffffffff0);
      ppSVar13 = (String **)((long)&local_58 + lVar3);
      ((char **)ppSVar13)[lVar8] = (char *)0x0;
      *(undefined8 *)((long)&lStack_60 + lVar3) = 1;
      for (lVar11 = *(long *)((long)&lStack_60 + lVar3); lVar11 < lVar8; lVar11 = lVar11 + 1) {
        ((char **)ppSVar13)[lVar11] = argv[lVar11];
      }
      *(undefined8 *)((long)&lStack_60 + lVar3) = 0x10317f;
      pcVar9 = String::operator_cast_to_char_(program);
      *ppSVar13 = (String *)pcVar9;
      argv = (char **)ppSVar13;
    }
    envStringsBuf._end.item = (String *)0x0;
    auStack_48 = (undefined1  [8])0x0;
    envStringsBuf._begin.item = (String *)0x0;
    ppcVar12 = _environ;
    local_50 = argv;
    if (environment->root != (Item *)0x0) {
      local_58 = program;
      ((char **)ppSVar13)[-1] = (char *)0x1031b9;
      anon_unknown.dwarf_5c2c::prepareEnv(environment,(Array<String> *)auStack_48);
      IVar4 = envStringsBuf._begin;
      this_00 = auStack_48;
      lVar11 = (long)envStringsBuf._begin.item - (long)auStack_48;
      ((char **)ppSVar13)[-1] = (char *)0x28;
      ppSVar13 = (String **)
                 ((long)ppSVar13 -
                 ((lVar11 / (long)((char **)ppSVar13)[-1]) * 8 + 0x17U & 0xfffffffffffffff0));
      ppcVar12 = (char **)ppSVar13;
      for (; this_00 != (undefined1  [8])IVar4.item;
          this_00 = (undefined1  [8])((long)this_00 + 0x28)) {
        ((char **)ppSVar13)[-1] = (char *)0x1031f4;
        pcVar9 = String::operator_cast_to_char_((String *)this_00);
        *ppcVar12 = pcVar9;
        ppcVar12 = ppcVar12 + 1;
      }
      *ppcVar12 = (char *)0x0;
      program = local_58;
      ppcVar12 = (char **)ppSVar13;
    }
    ((char **)ppSVar13)[-1] = (char *)0x10320e;
    uVar5 = vfork();
    if (uVar5 == 0xffffffff) {
      uVar5 = 0;
    }
    else if (uVar5 == 0) {
      ((char **)ppSVar13)[-1] = (char *)0x10321f;
      pcVar9 = String::operator_cast_to_char_(program);
      __argv = local_50;
      ((char **)ppSVar13)[-1] = (char *)0x10322e;
      iVar6 = execvpe(pcVar9,__argv,ppcVar12);
      __stream = _stderr;
      if (iVar6 == -1) {
        ((char **)ppSVar13)[-1] = (char *)0x103292;
        pcVar9 = String::operator_cast_to_char_(program);
        ((char **)ppSVar13)[-1] = (char *)0x10329a;
        piVar7 = __errno_location();
        iVar6 = *piVar7;
        ((char **)ppSVar13)[-1] = (char *)0x1032a1;
        pcVar10 = strerror(iVar6);
        ((char **)ppSVar13)[-1] = (char *)0x1032b8;
        fprintf(__stream,"%s: %s\n",pcVar9,pcVar10);
        ((char **)ppSVar13)[-1] = (char *)0x1;
        uVar1 = ((char **)ppSVar13)[-1];
        ((char **)ppSVar13)[-1] = &LAB_001032c0;
        _exit((int)uVar1);
      }
      uVar5 = 0;
      ((char **)ppSVar13)[-1] = (char *)0x103256;
      iVar6 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Process.cpp"
                            ,0x13d,"false");
      if (iVar6 != 0) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
    }
    else {
      this->pid = uVar5;
    }
    ((char **)ppSVar13)[-1] = (char *)0x10326f;
    Array<String>::~Array((Array<String> *)auStack_48);
  }
  else {
    lStack_60 = 0x10311a;
    piVar7 = __errno_location();
    *piVar7 = 0x16;
    uVar5 = 0;
  }
  return uVar5;
}

Assistant:

uint32 Process::start(const String& program, int argc, char* const argv[], const Map<String, String>& environment)
{
#ifdef _WIN32
  return start(Private::getCommandLine(program, argc, argv), environment);
#else
  if (pid)
  {
    errno = EINVAL;
    return false;
  }

  // prepare argv of child
  const char** args;
  if(argc && !argv[argc - 1])
    args = (const char**)argv;
  else
  {
    if(!argc)
      ++argc;
    args = (const char**)alloca(sizeof(const char*) * (argc + 1));
    args[argc] = 0;
    for (int i = 1; i < argc; ++i)
      args[i] = argv[i];
    args[0] = program;
  }

  // prepare env of child
  char** env = ::environ;
  Array<String> envStringsBuf;
  if (!environment.isEmpty())
  {
    prepareEnv(environment, envStringsBuf);
    env = (char**)alloca(sizeof(char*) * (envStringsBuf.size() + 1));
    char** ienv = env;
    for (Array<String>::Iterator i = envStringsBuf.begin(), end = envStringsBuf.end(); i != end; ++i)
      *(ienv++) = (char*)(const char*)*i;
    *ienv = 0;
  }

  // start process
  int r = vfork();
  if (r == -1)
    return 0;
  else if (r != 0) // parent
  {
    pid = r;
    return r;
  }
  else // child
  {
    if(execvpe(program, (char* const*)args, env) == -1)
    {
      fprintf(stderr, "%s: %s\n", (const char*)program, strerror(errno));
      _exit(EXIT_FAILURE);
    }
    ASSERT(false); // unreachable
    return 0;
  }
#endif
}